

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSyncTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::egl::anon_unknown_0::WaitSyncInvalidDisplayTest::iterate(WaitSyncInvalidDisplayTest *this)

{
  ostringstream *poVar1;
  EGLenum EVar2;
  TestLog *pTVar3;
  int iVar4;
  deUint32 err;
  int iVar5;
  Library *pLVar6;
  undefined4 extraout_var;
  size_t sVar7;
  TestError *this_00;
  char *pcVar8;
  qpTestResult testResult;
  TestContext *this_01;
  char *__s;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  pLVar6 = EglTestContext::getLibrary((this->super_SyncTest).super_TestCase.m_eglTestCtx);
  pTVar3 = ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar4 = (*pLVar6->_vptr_Library[0x11])
                    (pLVar6,(this->super_SyncTest).m_eglDisplay,
                     (ulong)(this->super_SyncTest).m_syncType,0);
  (this->super_SyncTest).m_sync = (EGLSyncKHR)CONCAT44(extraout_var,iVar4);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar3;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::ostream::_M_insert<void_const*>(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = eglCreateSyncKHR(",0x14);
  std::ostream::_M_insert<void_const*>(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  EVar2 = (this->super_SyncTest).m_syncType;
  pcVar8 = "<Unknown>";
  if (EVar2 == 0x30fa) {
    pcVar8 = "EGL_SYNC_REUSABLE_KHR";
  }
  __s = "EGL_SYNC_FENCE_KHR";
  if (EVar2 != 0x30f9) {
    __s = pcVar8;
  }
  sVar7 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,__s,sVar7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", NULL)",7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  err = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
  eglu::checkError(err,"eglCreateSyncKHR()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                   ,0x450);
  iVar4 = (*pLVar6->_vptr_Library[0x3a])(pLVar6,0,(this->super_SyncTest).m_sync,0);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar3;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::ostream::operator<<(poVar1,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1," = eglWaitSyncKHR(EGL_NO_DISPLAY, ",0x22);
  std::ostream::_M_insert<void_const*>(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", 0)",4);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  iVar5 = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar3;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::ostream::operator<<(poVar1,iVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = eglGetError()",0x10);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  if (iVar5 == 0x3008) {
    if (iVar4 != 0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,(char *)0x0,"status == EGL_FALSE",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                 ,0x45f);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    this_01 = (this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    pcVar8 = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = pTVar3;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Unexpected error \'",0x12)
    ;
    local_1c0.m_getName = eglu::getErrorName;
    local_1c0.m_value = iVar5;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"\' expected EGL_BAD_DISPLAY",0x1a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    this_01 = (this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    pcVar8 = "Fail";
    testResult = QP_TEST_RESULT_FAIL;
  }
  tcu::TestContext::setTestResult(this_01,testResult,pcVar8);
  return STOP;
}

Assistant:

IterateResult	iterate						(void)
	{
		const Library&	egl		= m_eglTestCtx.getLibrary();
		TestLog&		log		= m_testCtx.getLog();

		m_sync = egl.createSyncKHR(m_eglDisplay, m_syncType, NULL);
		log << TestLog::Message << m_sync << " = eglCreateSyncKHR(" << m_eglDisplay << ", " << getSyncTypeName(m_syncType) << ", NULL)" << TestLog::EndMessage;
		EGLU_CHECK_MSG(egl, "eglCreateSyncKHR()");

		EGLint status = egl.waitSyncKHR(EGL_NO_DISPLAY, m_sync, 0);
		log << TestLog::Message << status << " = eglWaitSyncKHR(EGL_NO_DISPLAY, " << m_sync << ", 0)" << TestLog::EndMessage;

		EGLint error = egl.getError();
		log << TestLog::Message << error << " = eglGetError()" << TestLog::EndMessage;

		if (error != EGL_BAD_DISPLAY)
		{
			log << TestLog::Message << "Unexpected error '" << eglu::getErrorStr(error) << "' expected EGL_BAD_DISPLAY" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		TCU_CHECK(status == EGL_FALSE);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}